

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<ProString,char[14]>
                    (QList<ProString> *vector,char (*u) [14],qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  ProString *in_RDX;
  QList<ProString> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  qsizetype in_stack_ffffffffffffff78;
  QList<ProString> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff98;
  ProString *this_00;
  qsizetype local_48;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RDX < 0) {
    qVar2 = QList<ProString>::size(in_RDI);
    local_10 = (long)&(in_RDX->m_string).d.d + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    in_RDX = (ProString *)*plVar3;
  }
  this_00 = in_RDX;
  qVar2 = QList<ProString>::size(in_RDI);
  if ((long)in_RDX < qVar2) {
    local_20.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    QList<ProString>::begin(in_stack_ffffffffffffff80);
    QList<ProString>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_20 = QList<ProString>::const_iterator::operator-
                         ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    cVar4 = QList<ProString>::end(in_stack_ffffffffffffff80);
    do {
      this = QList<ProString>::const_iterator::operator++(&local_20);
      bVar1 = QList<ProString>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_001bbe47;
      QList<ProString>::const_iterator::operator*(&local_20);
      bVar1 = ProString::operator==(this_00,in_stack_ffffffffffffff98);
    } while (!bVar1);
    cVar4 = QList<ProString>::begin(in_stack_ffffffffffffff80);
    local_48 = QList<ProString>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_001bbe47:
    local_48 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}